

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
          (basic_appender<char> out,unsigned_long value,format_specs *specs)

{
  basic_appender<char> it;
  long in_RDX;
  basic_appender<char> in_RDI;
  anon_class_16_2_92d121e5 write;
  size_t size;
  int num_digits;
  anon_class_16_2_92d121e5 *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  format_specs *in_stack_ffffffffffffffb0;
  reserve_iterator<fmt::v11::basic_appender<char>_> in_stack_ffffffffffffffb8;
  undefined8 local_8;
  
  count_digits<4,unsigned_long>((unsigned_long)in_stack_ffffffffffffffa0);
  to_unsigned<int>(0);
  if (in_RDX == 0) {
    reserve<char>((basic_appender<char>)in_stack_ffffffffffffffb8.container,(size_t)in_RDI.container
                 );
    it = write_ptr<char,_fmt::v11::basic_appender<char>,_unsigned_long>::anon_class_16_2_92d121e5::
         operator()(in_RDI.container,in_stack_ffffffffffffffb8);
    local_8 = base_iterator<fmt::v11::basic_appender<char>>(in_RDI,it);
  }
  else {
    local_8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>(fmt::v11::basic_appender<char>,unsigned_long,fmt::v11::format_specs_const*)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                        (in_RDI,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         in_stack_ffffffffffffffa0);
  }
  return (basic_appender<char>)local_8;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value, const format_specs* specs)
    -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_base2e<Char>(4, it, value, num_digits);
  };
  return specs ? write_padded<Char, align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}